

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::anon_unknown_0::IsCrossFileMaybeMap(FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *pDVar2;
  FieldDescriptor *this;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_18 = FieldDescriptor::TypeOnceInit;
    local_20 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_18,&local_20);
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar1 = FieldDescriptor::is_map_message_type(field), bVar1)) {
    pDVar2 = FieldDescriptor::message_type(field);
    this = Descriptor::FindFieldByNumber(pDVar2,2);
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_18 = FieldDescriptor::TypeOnceInit;
      local_20 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),&local_18,&local_20);
    }
    if ((this[2] == (FieldDescriptor)0xb) &&
       (pDVar2 = FieldDescriptor::message_type(this),
       *(long *)(pDVar2 + 0x10) != *(long *)(this + 0x10))) {
      return true;
    }
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_18 = FieldDescriptor::TypeOnceInit;
    local_20 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_18,&local_20);
  }
  if (field[2] == (FieldDescriptor)0xb) {
    pDVar2 = FieldDescriptor::message_type(field);
    bVar1 = *(long *)(pDVar2 + 0x10) != *(long *)(field + 0x10);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsCrossFileMaybeMap(const FieldDescriptor* field) {
  if (IsCrossFileMapField(field)) {
    return true;
  }

  return IsCrossFileMessage(field);
}